

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void bilinear_filter8xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  short sVar16;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar17 [16];
  undefined1 auVar25 [16];
  short sVar32;
  short sVar33;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar34 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  short sVar56;
  undefined1 auVar57 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar35 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  auVar7 = _DAT_0046b720;
  if (xoffset == 0) {
    for (lVar5 = 0; (int)lVar5 <= h; lVar5 = lVar5 + 1) {
      *(undefined8 *)(dst + lVar5 * 8) = *(undefined8 *)src;
      src = src + src_stride;
    }
  }
  else if (xoffset == 4) {
    for (lVar5 = 0; (int)lVar5 <= h; lVar5 = lVar5 + 1) {
      uVar8 = pavgb(src[1],*src);
      uVar9 = pavgb(src[2],src[1]);
      uVar10 = pavgb(src[3],src[2]);
      uVar11 = pavgb(src[4],src[3]);
      uVar12 = pavgb(src[5],src[4]);
      uVar13 = pavgb(src[6],src[5]);
      uVar14 = pavgb(src[7],src[6]);
      uVar15 = pavgb(src[8],src[7]);
      pavgb(src[9],src[8]);
      pavgb(src[10],src[9]);
      pavgb(src[0xb],src[10]);
      pavgb(src[0xc],src[0xb]);
      pavgb(src[0xd],src[0xc]);
      pavgb(src[0xe],src[0xd]);
      pavgb(src[0xf],src[0xe]);
      pavgb(0,src[0xf]);
      *(ulong *)(dst + lVar5 * 8) =
           CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(uVar12,CONCAT13(uVar11,CONCAT12(
                                                  uVar10,CONCAT11(uVar9,uVar8)))))));
      src = src + src_stride;
    }
  }
  else {
    auVar25 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                      ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    lVar5 = 0;
    while( true ) {
      auVar41 = *(undefined1 (*) [16])src;
      auVar40._0_14_ = auVar41._0_14_;
      auVar40[0xe] = auVar41[7];
      auVar40[0xf] = auVar41[8];
      auVar39._14_2_ = auVar40._14_2_;
      auVar39._0_13_ = auVar41._0_13_;
      auVar39[0xd] = auVar41[7];
      auVar38._13_3_ = auVar39._13_3_;
      auVar38._0_12_ = auVar41._0_12_;
      auVar38[0xc] = auVar41[6];
      auVar37._12_4_ = auVar38._12_4_;
      auVar37._0_11_ = auVar41._0_11_;
      auVar37[0xb] = auVar41[6];
      auVar36._11_5_ = auVar37._11_5_;
      auVar36._0_10_ = auVar41._0_10_;
      auVar36[10] = auVar41[5];
      auVar57._10_6_ = auVar36._10_6_;
      auVar57._0_9_ = auVar41._0_9_;
      auVar57[9] = auVar41[5];
      auVar35._9_7_ = auVar57._9_7_;
      auVar35._0_8_ = auVar41._0_8_;
      auVar35[8] = auVar41[4];
      auVar34._8_8_ = auVar35._8_8_;
      auVar34[7] = auVar41[4];
      auVar34[6] = auVar41[3];
      auVar34[5] = auVar41[3];
      auVar34[4] = auVar41[2];
      auVar34[3] = auVar41[2];
      auVar34[2] = auVar41[1];
      auVar34._0_2_ = auVar41._0_2_;
      auVar41._2_14_ = auVar34._2_14_;
      if (h <= (int)lVar5) break;
      auVar57 = pshufb(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + src_stride),auVar7);
      auVar41 = pmaddubsw(auVar41,auVar25);
      sVar16 = pavgw(auVar41._0_2_ >> 6,0);
      sVar26 = pavgw(auVar41._2_2_ >> 6,0);
      sVar27 = pavgw(auVar41._4_2_ >> 6,0);
      sVar28 = pavgw(auVar41._6_2_ >> 6,0);
      sVar29 = pavgw(auVar41._8_2_ >> 6,0);
      sVar30 = pavgw(auVar41._10_2_ >> 6,0);
      sVar31 = pavgw(auVar41._12_2_ >> 6,0);
      sVar32 = pavgw(auVar41._14_2_ >> 6,0);
      auVar41 = pmaddubsw(auVar57,auVar25);
      sVar33 = pavgw(auVar41._0_2_ >> 6,0);
      sVar50 = pavgw(auVar41._2_2_ >> 6,0);
      sVar51 = pavgw(auVar41._4_2_ >> 6,0);
      sVar52 = pavgw(auVar41._6_2_ >> 6,0);
      sVar53 = pavgw(auVar41._8_2_ >> 6,0);
      sVar54 = pavgw(auVar41._10_2_ >> 6,0);
      sVar55 = pavgw(auVar41._12_2_ >> 6,0);
      sVar56 = pavgw(auVar41._14_2_ >> 6,0);
      puVar1 = dst + lVar5 * 8;
      *puVar1 = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
      puVar1[1] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
      puVar1[2] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
      puVar1[3] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
      puVar1[4] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
      puVar1[5] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
      puVar1[6] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
      puVar1[7] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
      puVar1[8] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
      puVar1[9] = (0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50);
      puVar1[10] = (0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51);
      puVar1[0xb] = (0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52);
      puVar1[0xc] = (0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 - (0xff < sVar53);
      puVar1[0xd] = (0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54);
      puVar1[0xe] = (0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55);
      puVar1[0xf] = (0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56);
      src = *(undefined1 (*) [16])src + src_stride * 2;
      lVar5 = lVar5 + 2;
    }
    auVar7 = pmaddubsw(auVar41,auVar25);
    sVar16 = pavgw(0,auVar7._0_2_ >> 6);
    sVar26 = pavgw(0,auVar7._2_2_ >> 6);
    sVar27 = pavgw(0,auVar7._4_2_ >> 6);
    sVar28 = pavgw(0,auVar7._6_2_ >> 6);
    sVar29 = pavgw(0,auVar7._8_2_ >> 6);
    sVar30 = pavgw(0,auVar7._10_2_ >> 6);
    sVar31 = pavgw(0,auVar7._12_2_ >> 6);
    sVar32 = pavgw(0,auVar7._14_2_ >> 6);
    *(ulong *)(dst + lVar5 * 8) =
         CONCAT17((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32),
                  CONCAT16((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31),
                           CONCAT15((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30)
                                    ,CONCAT14((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 -
                                              (0xff < sVar29),
                                              CONCAT13((0 < sVar28) * (sVar28 < 0x100) *
                                                       (char)sVar28 - (0xff < sVar28),
                                                       CONCAT12((0 < sVar27) * (sVar27 < 0x100) *
                                                                (char)sVar27 - (0xff < sVar27),
                                                                CONCAT11((0 < sVar26) *
                                                                         (sVar26 < 0x100) *
                                                                         (char)sVar26 -
                                                                         (0xff < sVar26),
                                                                         (0 < sVar16) *
                                                                         (sVar16 < 0x100) *
                                                                         (char)sVar16 -
                                                                         (0xff < sVar16))))))));
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      uVar4 = 0;
      uVar6 = (ulong)(uint)h;
      if (h < 1) {
        uVar6 = uVar4;
      }
      for (; (int)uVar6 != (int)uVar4; uVar4 = uVar4 + 1) {
        uVar2 = *(undefined8 *)(dst + uVar4 * 8);
        uVar3 = *(undefined8 *)(dst + uVar4 * 8 + 8);
        uVar8 = pavgb((char)uVar3,(char)uVar2);
        uVar9 = pavgb((char)((ulong)uVar3 >> 8),(char)((ulong)uVar2 >> 8));
        uVar10 = pavgb((char)((ulong)uVar3 >> 0x10),(char)((ulong)uVar2 >> 0x10));
        uVar11 = pavgb((char)((ulong)uVar3 >> 0x18),(char)((ulong)uVar2 >> 0x18));
        uVar12 = pavgb((char)((ulong)uVar3 >> 0x20),(char)((ulong)uVar2 >> 0x20));
        uVar13 = pavgb((char)((ulong)uVar3 >> 0x28),(char)((ulong)uVar2 >> 0x28));
        uVar14 = pavgb((char)((ulong)uVar3 >> 0x30),(char)((ulong)uVar2 >> 0x30));
        uVar15 = pavgb((char)((ulong)uVar3 >> 0x38),(char)((ulong)uVar2 >> 0x38));
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        *(ulong *)(dst + uVar4 * 8) =
             CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(uVar12,CONCAT13(uVar11,
                                                  CONCAT12(uVar10,CONCAT11(uVar9,uVar8)))))));
      }
    }
    else {
      auVar7 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                       ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar7._4_4_ = auVar7._0_4_;
      auVar7._8_4_ = auVar7._0_4_;
      auVar7._12_4_ = auVar7._0_4_;
      for (lVar5 = 0; (int)lVar5 < h; lVar5 = lVar5 + 2) {
        uVar6 = *(ulong *)(dst + lVar5 * 8);
        uVar4 = *(ulong *)(dst + lVar5 * 8 + 8);
        uVar2 = *(undefined8 *)(dst + lVar5 * 8 + 0x10);
        uVar14 = (undefined1)(uVar4 >> 0x38);
        auVar24._8_6_ = 0;
        auVar24._0_8_ = uVar6;
        auVar24[0xe] = (char)(uVar6 >> 0x38);
        auVar24[0xf] = uVar14;
        auVar23._14_2_ = auVar24._14_2_;
        auVar23._8_5_ = 0;
        auVar23._0_8_ = uVar6;
        uVar13 = (undefined1)(uVar4 >> 0x30);
        auVar23[0xd] = uVar13;
        auVar22._13_3_ = auVar23._13_3_;
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar6;
        auVar22[0xc] = (char)(uVar6 >> 0x30);
        auVar21._12_4_ = auVar22._12_4_;
        auVar21._8_3_ = 0;
        auVar21._0_8_ = uVar6;
        uVar12 = (undefined1)(uVar4 >> 0x28);
        auVar21[0xb] = uVar12;
        auVar20._11_5_ = auVar21._11_5_;
        auVar20._8_2_ = 0;
        auVar20._0_8_ = uVar6;
        auVar20[10] = (char)(uVar6 >> 0x28);
        auVar19._10_6_ = auVar20._10_6_;
        auVar19[8] = 0;
        auVar19._0_8_ = uVar6;
        uVar11 = (undefined1)(uVar4 >> 0x20);
        auVar19[9] = uVar11;
        auVar18._9_7_ = auVar19._9_7_;
        auVar18[8] = (char)(uVar6 >> 0x20);
        auVar18._0_8_ = uVar6;
        auVar17._8_8_ = auVar18._8_8_;
        uVar10 = (undefined1)(uVar4 >> 0x18);
        auVar17[7] = uVar10;
        auVar17[6] = (char)(uVar6 >> 0x18);
        uVar9 = (undefined1)(uVar4 >> 0x10);
        auVar17[5] = uVar9;
        auVar17[4] = (char)(uVar6 >> 0x10);
        uVar8 = (undefined1)(uVar4 >> 8);
        auVar17[3] = uVar8;
        auVar17[2] = (char)(uVar6 >> 8);
        auVar17[0] = (undefined1)uVar6;
        auVar42[0] = (undefined1)uVar4;
        auVar17[1] = auVar42[0];
        auVar25 = pmaddubsw(auVar17,auVar7);
        sVar16 = pavgw(auVar25._0_2_ >> 6,0);
        sVar26 = pavgw(auVar25._2_2_ >> 6,0);
        sVar27 = pavgw(auVar25._4_2_ >> 6,0);
        sVar28 = pavgw(auVar25._6_2_ >> 6,0);
        sVar29 = pavgw(auVar25._8_2_ >> 6,0);
        sVar30 = pavgw(auVar25._10_2_ >> 6,0);
        sVar31 = pavgw(auVar25._12_2_ >> 6,0);
        sVar32 = pavgw(auVar25._14_2_ >> 6,0);
        auVar49._8_6_ = 0;
        auVar49._0_8_ = uVar4;
        auVar49[0xe] = uVar14;
        auVar49[0xf] = (char)((ulong)uVar2 >> 0x38);
        auVar48._14_2_ = auVar49._14_2_;
        auVar48._8_5_ = 0;
        auVar48._0_8_ = uVar4;
        auVar48[0xd] = (char)((ulong)uVar2 >> 0x30);
        auVar47._13_3_ = auVar48._13_3_;
        auVar47._8_4_ = 0;
        auVar47._0_8_ = uVar4;
        auVar47[0xc] = uVar13;
        auVar46._12_4_ = auVar47._12_4_;
        auVar46._8_3_ = 0;
        auVar46._0_8_ = uVar4;
        auVar46[0xb] = (char)((ulong)uVar2 >> 0x28);
        auVar45._11_5_ = auVar46._11_5_;
        auVar45._8_2_ = 0;
        auVar45._0_8_ = uVar4;
        auVar45[10] = uVar12;
        auVar44._10_6_ = auVar45._10_6_;
        auVar44[8] = 0;
        auVar44._0_8_ = uVar4;
        auVar44[9] = (char)((ulong)uVar2 >> 0x20);
        auVar43._9_7_ = auVar44._9_7_;
        auVar43[8] = uVar11;
        auVar43._0_8_ = uVar4;
        auVar42._8_8_ = auVar43._8_8_;
        auVar42[7] = (char)((ulong)uVar2 >> 0x18);
        auVar42[6] = uVar10;
        auVar42[5] = (char)((ulong)uVar2 >> 0x10);
        auVar42[4] = uVar9;
        auVar42[3] = (char)((ulong)uVar2 >> 8);
        auVar42[2] = uVar8;
        auVar42[1] = (char)uVar2;
        auVar25 = pmaddubsw(auVar42,auVar7);
        sVar33 = pavgw(auVar25._0_2_ >> 6,0);
        sVar50 = pavgw(auVar25._2_2_ >> 6,0);
        sVar51 = pavgw(auVar25._4_2_ >> 6,0);
        sVar52 = pavgw(auVar25._6_2_ >> 6,0);
        sVar53 = pavgw(auVar25._8_2_ >> 6,0);
        sVar54 = pavgw(auVar25._10_2_ >> 6,0);
        sVar55 = pavgw(auVar25._12_2_ >> 6,0);
        sVar56 = pavgw(auVar25._14_2_ >> 6,0);
        puVar1 = dst + lVar5 * 8;
        *puVar1 = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
        puVar1[1] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
        puVar1[2] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
        puVar1[3] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar1[4] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar1[5] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar1[6] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar1[7] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar1[8] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar1[9] = (0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50);
        puVar1[10] = (0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51);
        puVar1[0xb] = (0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52);
        puVar1[0xc] = (0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 - (0xff < sVar53);
        puVar1[0xd] = (0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54);
        puVar1[0xe] = (0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55);
        puVar1[0xf] = (0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56);
      }
    }
  }
  return;
}

Assistant:

static void bilinear_filter8xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 8;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 8;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i res = filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x0 = _mm_loadu_si128((__m128i *)src);
    const __m128i z0 = _mm_srli_si128(x0, 1);

    __m128i v0 = _mm_unpacklo_epi8(x0, z0);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu8(x, y));
      dst += 8;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[16]);
      const __m128i res = filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}